

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O0

ValidatorKeys *
jbcoin::ValidatorKeys::make_ValidatorKeys(ValidatorKeys *__return_storage_ptr__,path *keyFile)

{
  uint32_t tokenSequence_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  KeyType KVar4;
  value_type *pvVar5;
  runtime_error *prVar6;
  string *psVar7;
  Value *pVVar8;
  reference_const_type secretKey;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668 [5];
  runtime_error *anon_var_0;
  uint32_t tokenSequence;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string local_530;
  undefined1 local_50a [8];
  optional<jbcoin::SecretKey> secret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  KeyType local_448;
  undefined1 local_441;
  KeyType keyType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [8];
  value_type field;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *__range1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *local_380;
  undefined1 local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  Value jKeys;
  Reader reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_220;
  ifstream ifsKeys;
  path *keyFile_local;
  
  pvVar5 = boost::filesystem::path::c_str(keyFile);
  std::ifstream::ifstream(&local_220,pvVar5,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    psVar7 = boost::filesystem::path::string_abi_cxx11_(keyFile);
    std::operator+(&local_250,"Failed to open key file: ",psVar7);
    std::runtime_error::runtime_error(prVar6,(string *)&local_250);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Json::Reader::Reader((Reader *)&jKeys.field_0x8);
  Json::Value::Value((Value *)local_350,nullValue);
  bVar2 = Json::Reader::parse((Reader *)&jKeys.field_0x8,(istream *)&local_220,(Value *)local_350);
  if (!bVar2) {
    local_371 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    psVar7 = boost::filesystem::path::string_abi_cxx11_(keyFile);
    std::operator+(&local_370,"Unable to parse json key file: ",psVar7);
    std::runtime_error::runtime_error(prVar6,(string *)&local_370);
    local_371 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&make_ValidatorKeys(boost::filesystem::path_const&)::
                                 requiredFields_abi_cxx11_);
    if (iVar3 != 0) {
      __range1._3_1_ = 1;
      local_380 = &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_,
                 "key_type",(allocator *)((long)&__range1 + 7));
      local_380 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   *)0x522fb0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  field_0x20,"secret_key",(allocator *)((long)&__range1 + 6));
      local_380 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   *)0x522fd0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  field_0x40,"token_sequence",(allocator *)((long)&__range1 + 5));
      local_380 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   *)0x522ff0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  field_0x60,"revoked",(allocator *)((long)&__range1 + 4));
      __range1._3_1_ = 0;
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 4));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   ::~array,&make_ValidatorKeys(boost::filesystem::path_const&)::
                             requiredFields_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&make_ValidatorKeys(boost::filesystem::path_const&)::
                           requiredFields_abi_cxx11_);
    }
  }
  __end1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
           ::begin(&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_);
  field.field_2._8_8_ =
       std::
       array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
       end(&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_);
  for (; __end1 != (const_iterator)field.field_2._8_8_; __end1 = __end1 + 1) {
    std::__cxx11::string::string((string *)local_3c0,(string *)__end1);
    bVar2 = Json::Value::isMember((Value *)local_350,(string *)local_3c0);
    if (!bVar2) {
      local_441 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      psVar7 = boost::filesystem::path::string_abi_cxx11_(keyFile);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyType,
                     "Key file \'",psVar7);
      std::operator+(&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyType,
                     "\' is missing \"");
      std::operator+(&local_400,&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
      ;
      std::operator+(&local_3e0,&local_400,"\" field");
      std::runtime_error::runtime_error(prVar6,(string *)&local_3e0);
      local_441 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)local_3c0);
  }
  pVVar8 = Json::Value::operator[]((Value *)local_350,"key_type");
  Json::Value::asString_abi_cxx11_(&local_468,pVVar8);
  KVar4 = keyTypeFromString(&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  local_448 = KVar4;
  if (KVar4 == invalid) {
    secret.super_type.m_storage.dummy_.data[0x18] = '\x01';
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    psVar7 = boost::filesystem::path::string_abi_cxx11_(keyFile);
    std::operator+(&local_4c8,"Key file \'",psVar7);
    std::operator+(&local_4a8,&local_4c8,"\' contains invalid \"key_type\" field: ");
    pVVar8 = Json::Value::operator[]((Value *)local_350,"key_type");
    Json::Value::toStyledString_abi_cxx11_
              ((string *)((long)&secret.super_type.m_storage.dummy_ + 0x19),pVVar8);
    std::operator+(&local_488,&local_4a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&secret.super_type.m_storage.dummy_ + 0x19));
    std::runtime_error::runtime_error(prVar6,(string *)&local_488);
    secret.super_type.m_storage.dummy_.data[0x18] = '\0';
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar8 = Json::Value::operator[]((Value *)local_350,"secret_key");
  Json::Value::asString_abi_cxx11_(&local_530,pVVar8);
  parseBase58<jbcoin::SecretKey>
            ((optional<jbcoin::SecretKey> *)local_50a,TOKEN_NODE_PRIVATE,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  bVar2 = boost::optional<jbcoin::SecretKey>::operator!((optional<jbcoin::SecretKey> *)local_50a);
  if (!bVar2) {
    pVVar8 = Json::Value::operator[]((Value *)local_350,"token_sequence");
    bVar2 = Json::Value::isIntegral(pVVar8);
    if (!bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVVar8 = Json::Value::operator[]((Value *)local_350,"token_sequence");
    anon_var_0._0_4_ = Json::Value::asUInt(pVVar8);
    pVVar8 = Json::Value::operator[]((Value *)local_350,"revoked");
    bVar2 = Json::Value::isBool(pVVar8);
    if (!bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      psVar7 = boost::filesystem::path::string_abi_cxx11_(keyFile);
      std::operator+(&local_6a8,"Key file \'",psVar7);
      std::operator+(&local_688,&local_6a8,"\' contains invalid \"revoked\" field: ");
      pVVar8 = Json::Value::operator[]((Value *)local_350,"revoked");
      Json::Value::toStyledString_abi_cxx11_(&local_6c8,pVVar8);
      std::operator+(local_668,&local_688,&local_6c8);
      std::runtime_error::runtime_error(prVar6,(string *)local_668);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    secretKey = boost::optional<jbcoin::SecretKey>::operator*
                          ((optional<jbcoin::SecretKey> *)local_50a);
    tokenSequence_00 = (UInt)anon_var_0;
    pVVar8 = Json::Value::operator[]((Value *)local_350,"revoked");
    bVar2 = Json::Value::asBool(pVVar8);
    ValidatorKeys(__return_storage_ptr__,&local_448,secretKey,tokenSequence_00,bVar2);
    boost::optional<jbcoin::SecretKey>::~optional((optional<jbcoin::SecretKey> *)local_50a);
    Json::Value::~Value((Value *)local_350);
    Json::Reader::~Reader((Reader *)&jKeys.field_0x8);
    std::ifstream::~ifstream(&local_220);
    return __return_storage_ptr__;
  }
  anon_var_0._7_1_ = 1;
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  psVar7 = boost::filesystem::path::string_abi_cxx11_(keyFile);
  std::operator+(&local_590,"Key file \'",psVar7);
  std::operator+(&local_570,&local_590,"\' contains invalid \"secret_key\" field: ");
  pVVar8 = Json::Value::operator[]((Value *)local_350,"secret_key");
  Json::Value::toStyledString_abi_cxx11_((string *)&tokenSequence,pVVar8);
  std::operator+(&local_550,&local_570,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokenSequence
                );
  std::runtime_error::runtime_error(prVar6,(string *)&local_550);
  anon_var_0._7_1_ = 0;
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ValidatorKeys
ValidatorKeys::make_ValidatorKeys (
    boost::filesystem::path const& keyFile)
{
    std::ifstream ifsKeys (keyFile.c_str (), std::ios::in);

    if (! ifsKeys)
        throw std::runtime_error (
            "Failed to open key file: " + keyFile.string());

    Json::Reader reader;
    Json::Value jKeys;
    if (! reader.parse (ifsKeys, jKeys))
    {
        throw std::runtime_error (
            "Unable to parse json key file: " + keyFile.string());
    }

    static std::array<std::string, 4> const requiredFields {{
        "key_type",
        "secret_key",
        "token_sequence",
        "revoked"
    }};

    for (auto field : requiredFields)
    {
        if (! jKeys.isMember(field))
        {
            throw std::runtime_error (
                "Key file '" + keyFile.string() +
                "' is missing \"" + field + "\" field");
        }
    }

    auto const keyType = keyTypeFromString (jKeys["key_type"].asString());
    if (keyType == KeyType::invalid)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"key_type\" field: " +
            jKeys["key_type"].toStyledString());
    }

    auto const secret = parseBase58<SecretKey> (
        TokenType::TOKEN_NODE_PRIVATE, jKeys["secret_key"].asString());

    if (! secret)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"secret_key\" field: " +
            jKeys["secret_key"].toStyledString());
    }

    std::uint32_t tokenSequence;
    try {
        if (! jKeys["token_sequence"].isIntegral())
            throw std::runtime_error ("");

        tokenSequence = jKeys["token_sequence"].asUInt();
    }
    catch (std::runtime_error&)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"token_sequence\" field: " +
            jKeys["token_sequence"].toStyledString());
    }

    if (! jKeys["revoked"].isBool())
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"revoked\" field: " +
            jKeys["revoked"].toStyledString());

    return ValidatorKeys (
        keyType, *secret, tokenSequence, jKeys["revoked"].asBool());
}